

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::make_tran_string(string *__return_storage_ptr__,string *txt)

{
  bool bVar1;
  reference pcVar2;
  char chr;
  string local_1c0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  const_iterator pos;
  ostringstream os;
  string *txt_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pos);
  local_198._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_1a0._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_198,&local_1a0);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_198);
    transformed_abi_cxx11_(&local_1c0,(lest *)(ulong)(uint)(int)*pcVar2,chr);
    std::operator<<((ostream *)&pos,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_198);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pos);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_tran_string( std::string const & txt )
{
    std::ostringstream os;
    for( std::string::const_iterator pos = txt.begin(); pos != txt.end(); ++pos )
        os << transformed( *pos );
    return os.str();
}